

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayCardsAction.cpp
# Opt level: O1

void __thiscall PlayCardsAction::inversePlayBy(PlayCardsAction *this,Player *p)

{
  string local_60;
  CardGroup local_40;
  
  std::vector<Card_*,_std::allocator<Card_*>_>::vector(&local_40.cards,&(this->cards).cards);
  local_40.top = (this->cards).top;
  local_40._size = (this->cards)._size;
  Player::addCards(p,&local_40);
  CardGroup::~CardGroup(&local_40);
  Player::getName_abi_cxx11_(&local_60,p);
  printf("PlayCardsAction: %s withdraw ",local_60._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  CardGroup::print(&this->cards);
  putchar(10);
  return;
}

Assistant:

void PlayCardsAction::inversePlayBy(Player* p) const {
        p->addCards(this->cards);
        printf("PlayCardsAction: %s withdraw ", p->getName().c_str());
        this->cards.print();
        puts("");
}